

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afk.cc
# Opt level: O1

void __thiscall AfkProcessor::flow_line(AfkProcessor *this,Params *args)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (this->currentLine_)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->currentLine_)._M_string_length);
  flow::Params::setResult(args,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AfkProcessor::flow_line(flow::Params& args) {
  args.setResult(currentLine_);
}